

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O1

CURLcode Curl_input_ntlm(connectdata *conn,_Bool proxy,char *header)

{
  byte *pbVar1;
  byte bVar2;
  curlntlm cVar3;
  int iVar4;
  CURLcode CVar5;
  ushort **ppuVar6;
  ntlmdata *ntlm;
  undefined7 in_register_00000031;
  char *type2msg;
  bool bVar7;
  
  iVar4 = Curl_raw_nequal("NTLM",header,4);
  if (iVar4 == 0) {
    return CURLE_OK;
  }
  ntlm = (ntlmdata *)
         ((conn->ntlm).nonce + ((ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 5) - 8));
  bVar2 = header[4];
  bVar7 = (ulong)bVar2 == 0;
  if (!bVar7) {
    type2msg = header + 4;
    ppuVar6 = __ctype_b_loc();
    bVar2 = *(byte *)((long)*ppuVar6 + (ulong)bVar2 * 2 + 1);
    while ((bVar2 & 0x20) != 0) {
      pbVar1 = (byte *)(type2msg + 1);
      bVar7 = (ulong)*pbVar1 == 0;
      if (bVar7) goto LAB_00142dd4;
      type2msg = type2msg + 1;
      bVar2 = *(byte *)((long)*ppuVar6 + (ulong)*pbVar1 * 2 + 1);
    }
    if (!bVar7) {
      CVar5 = Curl_auth_decode_ntlm_type2_message(conn->data,type2msg,ntlm);
      if (CVar5 == CURLE_OK) {
        ntlm->state = NTLMSTATE_TYPE2;
        return CURLE_OK;
      }
      return CVar5;
    }
  }
LAB_00142dd4:
  cVar3 = ntlm->state;
  if (cVar3 != NTLMSTATE_NONE) {
    if (cVar3 == NTLMSTATE_TYPE3) {
      Curl_infof(conn->data,"NTLM handshake rejected\n");
      Curl_auth_ntlm_cleanup(&conn->ntlm);
      Curl_auth_ntlm_cleanup(&conn->proxyntlm);
      ntlm->state = NTLMSTATE_NONE;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    if (cVar3 != NTLMSTATE_LAST) {
      Curl_infof(conn->data,"NTLM handshake failure (internal error)\n");
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    Curl_infof(conn->data,"NTLM auth restarted\n");
    Curl_auth_ntlm_cleanup(&conn->ntlm);
    Curl_auth_ntlm_cleanup(&conn->proxyntlm);
  }
  ntlm->state = NTLMSTATE_TYPE1;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_input_ntlm(struct connectdata *conn,
                         bool proxy,         /* if proxy or not */
                         const char *header) /* rest of the www-authenticate:
                                                header */
{
  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  CURLcode result = CURLE_OK;

  ntlm = proxy ? &conn->proxyntlm : &conn->ntlm;

  if(checkprefix("NTLM", header)) {
    header += strlen("NTLM");

    while(*header && ISSPACE(*header))
      header++;

    if(*header) {
      result = Curl_auth_decode_ntlm_type2_message(conn->data, header, ntlm);
      if(result)
        return result;

      ntlm->state = NTLMSTATE_TYPE2; /* We got a type-2 message */
    }
    else {
      if(ntlm->state == NTLMSTATE_LAST) {
        infof(conn->data, "NTLM auth restarted\n");
        Curl_http_ntlm_cleanup(conn);
      }
      else if(ntlm->state == NTLMSTATE_TYPE3) {
        infof(conn->data, "NTLM handshake rejected\n");
        Curl_http_ntlm_cleanup(conn);
        ntlm->state = NTLMSTATE_NONE;
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      else if(ntlm->state >= NTLMSTATE_TYPE1) {
        infof(conn->data, "NTLM handshake failure (internal error)\n");
        return CURLE_REMOTE_ACCESS_DENIED;
      }

      ntlm->state = NTLMSTATE_TYPE1; /* We should send away a type-1 */
    }
  }

  return result;
}